

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

size_t sysbvm_jit_emitObjectFileJittedFunctionName(sysbvm_bytecodeJit_t *jit)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t entryCount;
  undefined1 local_51;
  uint local_50;
  uint uStack_4c;
  char nullTerminator;
  uint32_t sourceColumn;
  uint32_t sourceLine;
  char pointerBuffer [32];
  _Bool hasEmittedName;
  size_t nameOffset;
  sysbvm_bytecodeJit_t *jit_local;
  
  sVar1 = (jit->objectFileContent).size;
  jit->objectFileContentJittedFunctionNameOffset = sVar1;
  _Var2 = sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                    (jit,(sysbvm_programEntity_t *)jit->compiledProgramEntity);
  if (!_Var2) {
    sysbvm_sourcePosition_getStartLineAndColumn
              (jit->context,jit->sourcePosition,&stack0xffffffffffffffb4,&local_50);
    sVar3 = sysbvm_tuple_identityHash(jit->compiledProgramEntity);
    snprintf((char *)&sourceColumn,0x20,"%d:%d-%08llx",(ulong)uStack_4c,(ulong)local_50,sVar3);
    entryCount = strlen((char *)&sourceColumn);
    sysbvm_dynarray_addAll(&jit->objectFileContent,entryCount,&sourceColumn);
  }
  local_51 = 0;
  sysbvm_dynarray_add(&jit->objectFileContent,&local_51);
  return sVar1;
}

Assistant:

static size_t sysbvm_jit_emitObjectFileJittedFunctionName(sysbvm_bytecodeJit_t *jit)
{
    size_t nameOffset = jit->objectFileContent.size;
    jit->objectFileContentJittedFunctionNameOffset = nameOffset;

    // Emit the program entity name;
    bool hasEmittedName = sysbvm_jit_emitObjectFileProgramEntityRecursiveName(jit, (sysbvm_programEntity_t*)jit->compiledProgramEntity);

    // Function source location and pointer number.
    if(!hasEmittedName)
    {
        char pointerBuffer[32];
        uint32_t sourceLine, sourceColumn;
        sysbvm_sourcePosition_getStartLineAndColumn(jit->context, jit->sourcePosition, &sourceLine, &sourceColumn);

        snprintf(pointerBuffer, sizeof(pointerBuffer), "%d:%d-%08llx", sourceLine, sourceColumn, (unsigned long long)sysbvm_tuple_identityHash(jit->compiledProgramEntity));
        sysbvm_dynarray_addAll(&jit->objectFileContent, strlen(pointerBuffer), pointerBuffer);
    }

    char nullTerminator = 0;
    sysbvm_dynarray_add(&jit->objectFileContent, &nullTerminator);

    return nameOffset;
}